

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstruct<std::complex<long_double>_>::ComputeWeights
          (TPZDohrSubstruct<std::complex<long_double>_> *this,
          TPZFMatrix<std::complex<long_double>_> *StiffnessDiag)

{
  TPZFMatrix<std::complex<long_double>_> *pTVar1;
  int64_t iVar2;
  pair<int,_int> *ppVar3;
  complex<long_double> *pcVar4;
  long lVar5;
  int *piVar6;
  TPZFMatrix<std::complex<long_double>_> *in_RDI;
  pair<int,_int> ind;
  int neqs;
  int i;
  complex<long_double> *in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff90;
  undefined6 in_stack_ffffffffffffff92;
  int64_t in_stack_ffffffffffffffa0;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  int local_20;
  int local_14;
  
  iVar2 = TPZVec<std::pair<int,_int>_>::NElements
                    ((TPZVec<std::pair<int,_int>_> *)
                     &in_RDI[0xc].super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.
                      fRow);
  for (local_14 = 0; local_14 < (int)iVar2; local_14 = local_14 + 1) {
    ppVar3 = TPZVec<std::pair<int,_int>_>::operator[]
                       ((TPZVec<std::pair<int,_int>_> *)
                        &in_RDI[0xc].super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix
                         .fRow,(long)local_14);
    local_20 = (*ppVar3).first;
    pcVar4 = TPZVec<std::complex<long_double>_>::operator[]
                       ((TPZVec<std::complex<long_double>_> *)&in_RDI[8].fSize,(long)local_20);
    TPZFMatrix<std::complex<long_double>_>::operator()
              (in_RDI,(int64_t)pcVar4,in_stack_ffffffffffffffa0);
    std::operator/((complex<long_double> *)
                   CONCAT62(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88);
    pcVar4 = TPZVec<std::complex<long_double>_>::operator[]
                       ((TPZVec<std::complex<long_double>_> *)&in_RDI[8].fSize,(long)local_20);
    *(undefined8 *)pcVar4->_M_value = local_48;
    *(undefined8 *)(pcVar4->_M_value + 8) = local_40;
    *(undefined8 *)(pcVar4->_M_value + 0x10) = local_38;
    *(undefined8 *)(pcVar4->_M_value + 0x18) = local_30;
  }
  local_14 = 0;
  while( true ) {
    lVar5 = (long)local_14;
    iVar2 = TPZVec<int>::NElements((TPZVec<int> *)in_RDI[0x11].fPivot.fExtAlloc);
    if (iVar2 <= lVar5) break;
    pTVar1 = in_RDI + 8;
    piVar6 = TPZVec<int>::operator[]((TPZVec<int> *)in_RDI[0x11].fPivot.fExtAlloc,(long)local_14);
    pcVar4 = TPZVec<std::complex<long_double>_>::operator[]
                       ((TPZVec<std::complex<long_double>_> *)&pTVar1->fSize,(long)*piVar6);
    std::complex<long_double>::operator=(pcVar4,(longdouble)1);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::ComputeWeights(TPZFMatrix<TVar> &StiffnessDiag) {
	int i;
	//fWeights.Fill(1.);
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		fWeights[ind.first] = fWeights[ind.first] / StiffnessDiag(ind.second,0);
	}
	for(i=0; i<fInternalEqs.NElements(); i++)
	{
		fWeights[fInternalEqs[i]] = 1.;
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Weights = " <<  fWeights;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
}